

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsPublication
helicsFederateRegisterGlobalTypePublication
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  string_view units_00;
  size_t sVar1;
  size_t sVar2;
  Publication *pPVar3;
  HelicsPublication pvVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  string_view name;
  string_view type_00;
  __single_object pub;
  shared_ptr<helics::ValueFederate> fedObj;
  _Head_base<0UL,_helics::PublicationObject_*,_false> local_70;
  __uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
  local_68;
  __shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2> local_60;
  HelicsError *local_50;
  ValueFederate *local_48;
  size_t local_40;
  char *pcStack_38;
  
  getValueFedSharedPtr(&local_60,(HelicsError *)fed);
  if (local_60._M_ptr == (ValueFederate *)0x0) {
    pvVar4 = (HelicsPublication)0x0;
  }
  else {
    local_50 = err;
    std::make_unique<helics::PublicationObject>();
    local_48 = local_60._M_ptr;
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (key != (char *)0x0) {
      sVar1 = strlen(key);
      _Var5._M_p = key;
    }
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar2 = strlen(type);
      _Var6._M_p = type;
    }
    local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    pcStack_38 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      local_40 = strlen(units);
      pcStack_38 = units;
    }
    units_00._M_str = pcStack_38;
    units_00._M_len = local_40;
    name._M_str = _Var5._M_p;
    name._M_len = sVar1;
    type_00._M_str = _Var6._M_p;
    type_00._M_len = sVar2;
    pPVar3 = helics::ValueFederate::registerGlobalPublication(local_48,name,type_00,units_00);
    (local_70._M_head_impl)->pubPtr = pPVar3;
    std::__shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_70._M_head_impl)->fedptr).
                super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>,&local_60);
    local_68._M_t.
    super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
    .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl =
         (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
         (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
         local_70._M_head_impl;
    local_70._M_head_impl = (PublicationObject *)0x0;
    pvVar4 = anon_unknown.dwarf_694c0::addPublication
                       (fed,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                             *)&local_68);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                 *)&local_68);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                 *)&local_70);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return pvVar4;
}

Assistant:

HelicsPublication
    helicsFederateRegisterGlobalTypePublication(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &fedObj->registerGlobalPublication(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}